

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuItem>::insert
          (QMovableArrayOps<QDBusMenuItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  int iVar2;
  QDBusMenuItem *pQVar3;
  long lVar4;
  qsizetype inserts;
  long in_FS_OFFSET;
  bool bVar5;
  QVariantMap local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = t->m_id;
  local_40.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )(t->m_properties).d.d.ptr;
  if (local_40.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_40.d.d.ptr = *(int *)local_40.d.d.ptr + 1;
    UNLOCK();
  }
  bVar5 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.size
          != 0;
  QArrayDataPointer<QDBusMenuItem>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuItem> *)this,(uint)(i == 0 && bVar5),n,
             (QDBusMenuItem **)0x0,(QArrayDataPointer<QDBusMenuItem> *)0x0);
  if (i == 0 && bVar5) {
    if (n != 0) {
      pQVar3 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               ptr;
      do {
        pQVar3[-1].m_id = iVar2;
        pQVar3[-1].m_properties.d.d.ptr =
             (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
              *)local_40.d.d.ptr;
        if (local_40.d.d.ptr !=
            (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
             )0x0) {
          LOCK();
          *(int *)local_40.d.d.ptr = *(int *)local_40.d.d.ptr + 1;
          UNLOCK();
        }
        n = n + -1;
        pQVar3 = (this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr + -1;
        (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.ptr =
             pQVar3;
        pqVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                  super_QArrayDataPointer<QDBusMenuItem>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (n != 0);
    }
  }
  else {
    pQVar3 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
             ptr + i;
    memmove(pQVar3 + n,pQVar3,
            ((this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
             size - i) * 0x10);
    lVar4 = n;
    if (n != 0) {
      do {
        pQVar3->m_id = iVar2;
        (pQVar3->m_properties).d.d.ptr =
             (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
              *)local_40.d.d.ptr;
        if (local_40.d.d.ptr !=
            (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
             )0x0) {
          LOCK();
          *(int *)local_40.d.d.ptr = *(int *)local_40.d.d.ptr + 1;
          UNLOCK();
        }
        lVar4 = lVar4 + -1;
        pQVar3 = pQVar3 + 1;
      } while (lVar4 != 0);
    }
    pqVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
    *pqVar1 = *pqVar1 + n;
  }
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_40.d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }